

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

void tcu::fillWithComponentGradients(PixelBufferAccess *access,Vec4 *minVal,Vec4 *maxVal)

{
  ChannelOrder CVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int x;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  PixelBufferAccess local_80;
  Vec4 *local_58;
  Vec4 local_50;
  Vec4 local_40;
  
  uVar2 = (ulong)(access->super_ConstPixelBufferAccess).m_format.type;
  if ((uVar2 < 0x26) && ((0x2007000000U >> (uVar2 & 0x3f) & 1) != 0)) {
    CVar1 = (access->super_ConstPixelBufferAccess).m_format.order;
    if ((CVar1 == DS) || (CVar1 == D)) {
      getEffectiveDepthStencilAccess(&local_80,access,MODE_DEPTH);
      fillWithComponentGradients(&local_80,minVal,maxVal);
    }
    if (CVar1 - S < 2) {
      getEffectiveDepthStencilAccess(&local_80,access,MODE_STENCIL);
      local_40.m_data[0] = minVal->m_data[3];
      local_40.m_data[1] = minVal->m_data[2];
      local_40.m_data[3] = minVal->m_data[0];
      local_40.m_data[2] = minVal->m_data[1];
      local_50.m_data[0] = maxVal->m_data[3];
      local_50.m_data[1] = maxVal->m_data[2];
      local_50.m_data[3] = maxVal->m_data[0];
      local_50.m_data[2] = maxVal->m_data[1];
      fillWithComponentGradients(&local_80,&local_40,&local_50);
    }
  }
  else {
    iVar4 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
    if ((iVar4 == 1) && ((access->super_ConstPixelBufferAccess).m_size.m_data[2] == 1)) {
      iVar4 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
      if (0 < iVar4) {
        iVar3 = 0;
        do {
          fVar6 = ((float)iVar3 + 0.5) / (float)iVar4;
          local_80.super_ConstPixelBufferAccess.m_format.order =
               (ChannelOrder)((maxVal->m_data[0] - minVal->m_data[0]) * fVar6 + minVal->m_data[0]);
          local_80.super_ConstPixelBufferAccess.m_format.type =
               (ChannelType)((maxVal->m_data[1] - minVal->m_data[1]) * fVar6 + minVal->m_data[1]);
          local_80.super_ConstPixelBufferAccess.m_size.m_data[0] =
               (int)((maxVal->m_data[2] - minVal->m_data[2]) * fVar6 + minVal->m_data[2]);
          local_80.super_ConstPixelBufferAccess.m_size.m_data[1] =
               (int)((maxVal->m_data[3] - minVal->m_data[3]) * fVar6 + minVal->m_data[3]);
          PixelBufferAccess::setPixel(access,(Vec4 *)&local_80,iVar3,0,0);
          iVar3 = iVar3 + 1;
          iVar4 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
        } while (iVar3 < iVar4);
      }
    }
    else {
      iVar3 = (access->super_ConstPixelBufferAccess).m_size.m_data[2];
      if (iVar3 == 1) {
        if (0 < iVar4) {
          iVar4 = 0;
          do {
            iVar3 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
            if (0 < iVar3) {
              iVar5 = 0;
              do {
                fVar7 = ((float)iVar5 + 0.5) / (float)iVar3;
                fVar6 = ((float)iVar4 + 0.5) /
                        (float)(access->super_ConstPixelBufferAccess).m_size.m_data[1];
                local_80.super_ConstPixelBufferAccess.m_format.order =
                     (ChannelOrder)
                     ((maxVal->m_data[0] - minVal->m_data[0]) * (fVar7 + fVar6) * 0.5 +
                     minVal->m_data[0]);
                local_80.super_ConstPixelBufferAccess.m_format.type =
                     (ChannelType)
                     ((maxVal->m_data[1] - minVal->m_data[1]) * (fVar7 + (1.0 - fVar6)) * 0.5 +
                     minVal->m_data[1]);
                local_80.super_ConstPixelBufferAccess.m_size.m_data[0] =
                     (int)((maxVal->m_data[2] - minVal->m_data[2]) * (fVar6 + (1.0 - fVar7)) * 0.5 +
                          minVal->m_data[2]);
                local_80.super_ConstPixelBufferAccess.m_size.m_data[1] =
                     (int)((maxVal->m_data[3] - minVal->m_data[3]) *
                           ((1.0 - fVar7) + (1.0 - fVar6)) * 0.5 + minVal->m_data[3]);
                PixelBufferAccess::setPixel(access,(Vec4 *)&local_80,iVar5,iVar4,0);
                iVar5 = iVar5 + 1;
                iVar3 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
              } while (iVar5 < iVar3);
            }
            iVar4 = iVar4 + 1;
          } while (iVar4 < (access->super_ConstPixelBufferAccess).m_size.m_data[1]);
        }
      }
      else if (0 < iVar3) {
        iVar4 = 0;
        local_58 = minVal;
        do {
          if (0 < (access->super_ConstPixelBufferAccess).m_size.m_data[1]) {
            iVar3 = 0;
            do {
              iVar5 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
              if (0 < iVar5) {
                x = 0;
                do {
                  fVar6 = ((float)x + 0.5) / (float)iVar5;
                  fVar7 = ((float)iVar3 + 0.5) /
                          (float)(access->super_ConstPixelBufferAccess).m_size.m_data[1];
                  fVar8 = ((float)iVar4 + 0.5) /
                          (float)(access->super_ConstPixelBufferAccess).m_size.m_data[2];
                  local_80.super_ConstPixelBufferAccess.m_format.order =
                       (ChannelOrder)
                       ((maxVal->m_data[0] - local_58->m_data[0]) * fVar6 + local_58->m_data[0]);
                  local_80.super_ConstPixelBufferAccess.m_format.type =
                       (ChannelType)
                       ((maxVal->m_data[1] - local_58->m_data[1]) * fVar7 + local_58->m_data[1]);
                  local_80.super_ConstPixelBufferAccess.m_size.m_data[0] =
                       (int)((maxVal->m_data[2] - local_58->m_data[2]) * fVar8 + local_58->m_data[2]
                            );
                  local_80.super_ConstPixelBufferAccess.m_size.m_data[1] =
                       (int)((maxVal->m_data[3] - local_58->m_data[3]) *
                             ((fVar7 + fVar6 + fVar8) / -3.0 + 1.0) + local_58->m_data[3]);
                  PixelBufferAccess::setPixel(access,(Vec4 *)&local_80,x,iVar3,iVar4);
                  x = x + 1;
                  iVar5 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
                } while (x < iVar5);
              }
              iVar3 = iVar3 + 1;
            } while (iVar3 < (access->super_ConstPixelBufferAccess).m_size.m_data[1]);
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < (access->super_ConstPixelBufferAccess).m_size.m_data[2]);
      }
    }
  }
  return;
}

Assistant:

void fillWithComponentGradients (const PixelBufferAccess& access, const Vec4& minVal, const Vec4& maxVal)
{
	if (isCombinedDepthStencilType(access.getFormat().type))
	{
		const bool hasDepth		= access.getFormat().order == tcu::TextureFormat::DS || access.getFormat().order == tcu::TextureFormat::D;
		const bool hasStencil	= access.getFormat().order == tcu::TextureFormat::DS || access.getFormat().order == tcu::TextureFormat::S;

		DE_ASSERT(hasDepth || hasStencil);

		// For combined formats, treat D and S as separate channels
		if (hasDepth)
			fillWithComponentGradients(getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_DEPTH), minVal, maxVal);
		if (hasStencil)
			fillWithComponentGradients(getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_STENCIL), minVal.swizzle(3,2,1,0), maxVal.swizzle(3,2,1,0));
	}
	else
	{
		if (access.getHeight() == 1 && access.getDepth() == 1)
			fillWithComponentGradients1D(access, minVal, maxVal);
		else if (access.getDepth() == 1)
			fillWithComponentGradients2D(access, minVal, maxVal);
		else
			fillWithComponentGradients3D(access, minVal, maxVal);
	}
}